

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

void __thiscall kj::anon_unknown_9::DiskHandle::datasync(DiskHandle *this)

{
  int iVar1;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  do {
    iVar1 = fdatasync((this->fd).fd);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void datasync() const {
    // The presence of the _POSIX_SYNCHRONIZED_IO define is supposed to tell us that fdatasync()
    // exists. But Apple defines this yet doesn't offer fdatasync(). Thanks, Apple.
#if _POSIX_SYNCHRONIZED_IO && !__APPLE__
    KJ_SYSCALL(fdatasync(fd));
#else
    this->sync();
#endif
  }